

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_segtree.cpp
# Opt level: O3

ll __thiscall Segtree::pointQuery(Segtree *this,int i)

{
  long lVar1;
  int iVar2;
  int iVar3;
  Segtree *pSVar4;
  
  iVar2 = this->l;
  iVar3 = this->r;
  if (iVar3 - iVar2 == 1) {
    lVar1 = 0;
  }
  else {
    lVar1 = 0;
    pSVar4 = this;
    do {
      this = (&pSVar4->lson)[(iVar2 + iVar3) / 2 <= i];
      lVar1 = lVar1 + pSVar4->val;
      iVar2 = this->l;
      iVar3 = this->r;
      pSVar4 = this;
    } while (iVar3 - iVar2 != 1);
  }
  return lVar1 + this->val;
}

Assistant:

ll pointQuery(int i) const {
        if (r - l == 1) return val;
        int mid = (l + r) / 2;
        return val + ((i < mid) ? lson : rson)->pointQuery(i);
    }